

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_tag.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::UnionTagBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  undefined4 *__src;
  undefined8 uVar1;
  string_t sVar2;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var3;
  reference pvVar4;
  pointer pEVar5;
  long lVar6;
  reference pvVar7;
  undefined8 *puVar8;
  ParameterNotResolvedException *this_00;
  BinderException *pBVar9;
  InternalException *this_01;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  LogicalType enum_type;
  Vector varchar_vector;
  Vector local_d8;
  undefined1 uStack_d7;
  undefined2 uStack_d6;
  undefined4 uStack_d4;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sStack_d0;
  long local_c0;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_b8;
  undefined1 *local_b0;
  LogicalType local_a8 [8];
  undefined1 local_a0 [16];
  long local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  LogicalType local_48 [24];
  
  if ((arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (arguments->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Missing required arguments for union_tag function.","");
    duckdb::BinderException::BinderException(pBVar9,(string *)&local_b0);
    __cxa_throw(pBVar9,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  if (pEVar5[0x38] == (Expression)0x2) {
    this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    duckdb::ParameterNotResolvedException::ParameterNotResolvedException(this_00);
    __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,std::runtime_error::~runtime_error)
    ;
  }
  pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar4);
  if (pEVar5[0x38] != (Expression)0x6b) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"First argument to union_tag function must be a union type.","");
    duckdb::BinderException::BinderException(pBVar9,(string *)&local_b0);
    __cxa_throw(pBVar9,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ulong)((long)(arguments->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(arguments->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 9) {
    local_b8._M_head_impl = (FunctionData *)this;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar4);
    lVar6 = duckdb::UnionType::GetMemberCount((LogicalType *)(pEVar5 + 0x38));
    if (lVar6 != 0) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      pvVar7 = vector<duckdb::LogicalType,_true>::operator[]
                         ((vector<duckdb::LogicalType,_true> *)&bound_function->field_0x48,0);
      if (pvVar7 != (reference)(pEVar5 + 0x38)) {
        *pvVar7 = (value_type)pEVar5[0x38];
        *(Expression *)(pvVar7 + 1) = pEVar5[0x39];
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar7 + 8),
                   (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar5 + 0x40));
      }
      duckdb::LogicalType::LogicalType(local_48,VARCHAR);
      duckdb::Vector::Vector((Vector *)&local_b0,local_48,lVar6);
      duckdb::LogicalType::~LogicalType(local_48);
      lVar12 = 8;
      uVar11 = 0;
      local_c0 = lVar6;
      do {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar4);
        puVar8 = (undefined8 *)
                 duckdb::UnionType::GetMemberName_abi_cxx11_((LogicalType *)(pEVar5 + 0x38),uVar11);
        __src = (undefined4 *)*puVar8;
        uVar1 = puVar8[1];
        uVar10 = (uint)uVar1;
        local_d8 = SUB81(uVar1,0);
        uStack_d7 = (undefined1)((ulong)uVar1 >> 8);
        uStack_d6 = (undefined2)((ulong)uVar1 >> 0x10);
        if (uVar10 < 0xd) {
          sStack_d0.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr._4_4_ = 0;
          uStack_d4 = 0;
          sStack_d0.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr._0_4_ = 0;
          if (uVar10 != 0) {
            memcpy(&uStack_d4,__src,(ulong)(uVar10 & 0xf));
          }
        }
        else {
          uStack_d4 = *__src;
          sStack_d0.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr._0_4_ = SUB84(__src,0);
          sStack_d0.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr._4_4_ = (undefined4)((ulong)__src >> 0x20);
        }
        auVar13[1] = uStack_d7;
        auVar13[0] = local_d8;
        auVar13._2_2_ = uStack_d6;
        auVar13._4_4_ = uStack_d4;
        auVar13._12_4_ =
             sStack_d0.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
        auVar13._8_4_ =
             sStack_d0.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_;
        sVar2.value.pointer.length._1_1_ = uStack_d7;
        sVar2.value.pointer.length._0_1_ = local_d8;
        sVar2.value.pointer.length._2_2_ = uStack_d6;
        sVar2.value._4_1_ = (undefined1)uStack_d4;
        sVar2.value._5_1_ = uStack_d4._1_1_;
        sVar2.value._6_1_ = uStack_d4._2_1_;
        sVar2.value._7_1_ = uStack_d4._3_1_;
        sVar2.value._8_4_ =
             sStack_d0.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_;
        sVar2.value._12_4_ =
             sStack_d0.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
        if (0xc < uVar10) {
          auVar13 = duckdb::StringVector::AddString((Vector *)&local_b0,sVar2);
        }
        *(long *)(local_90 + -8 + lVar12) = auVar13._0_8_;
        *(long *)(local_90 + lVar12) = auVar13._8_8_;
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar6 + (ulong)(lVar6 == 0) != uVar11);
      duckdb::LogicalType::ENUM(&local_d8,(ulong)&local_b0);
      if ((Vector *)&bound_function->field_0x90 != &local_d8) {
        bound_function->field_0x90 = local_d8;
        bound_function->field_0x91 = uStack_d7;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&bound_function->field_0x98,&sStack_d0
                  );
      }
      _Var3._M_head_impl = local_b8._M_head_impl;
      *(undefined8 *)local_b8._M_head_impl = 0;
      duckdb::LogicalType::~LogicalType((LogicalType *)&local_d8);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      duckdb::LogicalType::~LogicalType(local_a8);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             _Var3._M_head_impl;
    }
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Can\'t get tags from an empty union","");
    duckdb::InternalException::InternalException(this_01,(string *)&local_b0);
    __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"Too many arguments, union_tag takes at most one argument.","");
  duckdb::BinderException::BinderException(pBVar9,(string *)&local_b0);
  __cxa_throw(pBVar9,&BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> UnionTagBind(ClientContext &context, ScalarFunction &bound_function,
                                             vector<unique_ptr<Expression>> &arguments) {

	if (arguments.empty()) {
		throw BinderException("Missing required arguments for union_tag function.");
	}

	if (LogicalTypeId::UNKNOWN == arguments[0]->return_type.id()) {
		throw ParameterNotResolvedException();
	}

	if (LogicalTypeId::UNION != arguments[0]->return_type.id()) {
		throw BinderException("First argument to union_tag function must be a union type.");
	}

	if (arguments.size() > 1) {
		throw BinderException("Too many arguments, union_tag takes at most one argument.");
	}

	auto member_count = UnionType::GetMemberCount(arguments[0]->return_type);
	if (member_count == 0) {
		// this should never happen, empty unions are not allowed
		throw InternalException("Can't get tags from an empty union");
	}

	bound_function.arguments[0] = arguments[0]->return_type;

	auto varchar_vector = Vector(LogicalType::VARCHAR, member_count);
	for (idx_t i = 0; i < member_count; i++) {
		auto str = string_t(UnionType::GetMemberName(arguments[0]->return_type, i));
		FlatVector::GetData<string_t>(varchar_vector)[i] =
		    str.IsInlined() ? str : StringVector::AddString(varchar_vector, str);
	}
	auto enum_type = LogicalType::ENUM(varchar_vector, member_count);
	bound_function.return_type = enum_type;

	return nullptr;
}